

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall
TCLAP::CmdLine::xorAdd(CmdLine *this,vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *ors)

{
  Arg *this_00;
  bool bVar1;
  reference ppAVar2;
  allocator local_49;
  string local_48 [32];
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_28;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_20;
  ArgVectorIterator it;
  vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *ors_local;
  CmdLine *this_local;
  
  it._M_current = (Arg **)ors;
  XorHandler::add(&this->_xorHandler,ors);
  local_20._M_current =
       (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(it._M_current);
  while( true ) {
    local_28._M_current =
         (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(it._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppAVar2 = __gnu_cxx::
              __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
              ::operator*(&local_20);
    Arg::forceRequired(*ppAVar2);
    ppAVar2 = __gnu_cxx::
              __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
              ::operator*(&local_20);
    this_00 = *ppAVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"OR required",&local_49);
    Arg::setRequireLabel(this_00,(string *)local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    __gnu_cxx::
    __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>::
    operator*(&local_20);
    (*(this->super_CmdLineInterface)._vptr_CmdLineInterface[3])();
    __gnu_cxx::
    __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>::
    operator++(&local_20,0);
  }
  return;
}

Assistant:

inline void CmdLine::xorAdd( std::vector<Arg*>& ors )
{
	_xorHandler.add( ors );

	for (ArgVectorIterator it = ors.begin(); it != ors.end(); it++)
	{
		(*it)->forceRequired();
		(*it)->setRequireLabel( "OR required" );
		add( *it );
	}
}